

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

int __thiscall
rw::Material::clone(Material *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  float32 fVar1;
  FILE *__stream;
  char *pcVar2;
  Error local_28;
  Error _e;
  Material *mat;
  Material *this_local;
  
  _e = (Error)create();
  if (_e == (Error)0x0) {
    local_28.plugin = 7;
    local_28.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
            ,0x36f);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&local_28);
    this_local._0_4_ = 0;
  }
  else {
    *(RGBA *)((long)_e + 8) = this->color;
    fVar1 = (this->surfaceProps).specular;
    ((SurfaceProperties *)((long)_e + 0xc))->ambient = (this->surfaceProps).ambient;
    ((SurfaceProperties *)((long)_e + 0xc))->specular = fVar1;
    *(float32 *)((long)_e + 0x14) = (this->surfaceProps).diffuse;
    if (this->texture != (Texture *)0x0) {
      setTexture((Material *)_e,this->texture);
    }
    *(Pipeline **)((long)_e + 0x18) = this->pipeline;
    PluginList::copy((PluginList *)&s_plglist,(EVP_PKEY_CTX *)_e,(EVP_PKEY_CTX *)this);
    this_local._0_4_ = _e.plugin;
  }
  return (uint32)this_local;
}

Assistant:

Material*
Material::clone(void)
{
	Material *mat = Material::create();
	if(mat == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	mat->color = this->color;
	mat->surfaceProps = this->surfaceProps;
	if(this->texture)
		mat->setTexture(this->texture);
	mat->pipeline = this->pipeline;
	s_plglist.copy(mat, this);
	return mat;
}